

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBufferTestUtil.cpp
# Opt level: O1

void __thiscall
deqp::gls::BufferTestUtil::BufferWriter::BufferWriter
          (BufferWriter *this,RenderContext *renderCtx,TestLog *log,WriteType writeType)

{
  int iVar1;
  BufferWriterBase *pBVar2;
  undefined4 extraout_var;
  undefined **ppuVar3;
  undefined4 extraout_var_00;
  TestError *this_00;
  
  this->m_writer = (BufferWriterBase *)0x0;
  if (writeType == WRITE_BUFFER_WRITE_MAP) {
    pBVar2 = (BufferWriterBase *)operator_new(0x28);
    iVar1 = (*renderCtx->_vptr_RenderContext[3])(renderCtx);
    glu::CallLogWrapper::CallLogWrapper
              (&pBVar2->super_CallLogWrapper,(Functions *)CONCAT44(extraout_var_00,iVar1),log);
    pBVar2->m_renderCtx = renderCtx;
    (pBVar2->super_CallLogWrapper).m_enableLog = true;
    ppuVar3 = &PTR__BufferWriterBase_021ce5e8;
  }
  else {
    if (writeType != WRITE_BUFFER_SUB_DATA) {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Unsupported writer",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsBufferTestUtil.cpp"
                 ,0x113);
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    pBVar2 = (BufferWriterBase *)operator_new(0x28);
    iVar1 = (*renderCtx->_vptr_RenderContext[3])(renderCtx);
    glu::CallLogWrapper::CallLogWrapper
              (&pBVar2->super_CallLogWrapper,(Functions *)CONCAT44(extraout_var,iVar1),log);
    pBVar2->m_renderCtx = renderCtx;
    (pBVar2->super_CallLogWrapper).m_enableLog = true;
    ppuVar3 = &PTR__BufferWriterBase_021ce590;
  }
  pBVar2->_vptr_BufferWriterBase = (_func_int **)ppuVar3;
  this->m_writer = pBVar2;
  return;
}

Assistant:

BufferWriter::BufferWriter (glu::RenderContext& renderCtx, tcu::TestLog& log, WriteType writeType)
	: m_writer(DE_NULL)
{
	switch (writeType)
	{
		case WRITE_BUFFER_SUB_DATA:		m_writer = new BufferSubDataWriter	(renderCtx, log);	break;
		case WRITE_BUFFER_WRITE_MAP:	m_writer = new BufferWriteMapWriter	(renderCtx, log);	break;
		default:
			TCU_FAIL("Unsupported writer");
	}
}